

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O2

void __thiscall
quic::Bbr2ProbeBwMode::UpdateProbeRefill
          (Bbr2ProbeBwMode *this,Bbr2CongestionEvent *congestion_event)

{
  MaybeAdaptUpperBounds(this,congestion_event);
  if (((this->cycle_).rounds_in_phase != 0) && (congestion_event->end_of_round_trip == true)) {
    EnterProbeUp(this,(QuicTime)(congestion_event->event_time).time_);
    return;
  }
  return;
}

Assistant:

void Bbr2ProbeBwMode::UpdateProbeRefill(
    const Bbr2CongestionEvent& congestion_event) {
  //DCHECK_EQ(cycle_.phase, CyclePhase::PROBE_REFILL);
  MaybeAdaptUpperBounds(congestion_event);
  //DCHECK(!cycle_.is_sample_from_probing);

  if (cycle_.rounds_in_phase > 0 && congestion_event.end_of_round_trip) {
    EnterProbeUp(congestion_event.event_time);
    return;
  }
}